

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

void __thiscall
notch::io::PlainTextNetworkReader::read_layer_config
          (PlainTextNetworkReader *this,istream *in,size_t *inputDim,size_t *outputDim,
          string *activationTag,Array *weights,Array *bias)

{
  bool bVar1;
  runtime_error *prVar2;
  size_t *value;
  string tag;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  tag._M_dataplus._M_p = (pointer)&tag.field_2;
  tag._M_string_length = 0;
  tag.field_2._M_local_buf[0] = '\0';
LAB_00183a2b:
  do {
    if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 7) != 0) {
LAB_00183b40:
      std::__cxx11::string::~string((string *)&tag);
      return;
    }
    read_tag_abi_cxx11_(&local_70,this,in);
    std::__cxx11::string::operator=((string *)&tag,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) != 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"unexpected end of layer record");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &tag,"inputs:");
    value = inputDim;
    if (bVar1) {
LAB_00183a9b:
      read_value<unsigned_long>(this,in,value);
      goto LAB_00183a2b;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &tag,"outputs:");
    value = outputDim;
    if (bVar1) goto LAB_00183a9b;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &tag,"activation:");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &tag,"bias_and_weights:");
      if (!bVar1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_70,"unsupported layer attribute: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tag);
        std::runtime_error::runtime_error(prVar2,(string *)&local_70);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      core::std::valarray<float>::resize(weights,*outputDim * *inputDim,0.0);
      core::std::valarray<float>::resize(bias,*outputDim,0.0);
      read_weights(this,in,weights,bias);
      goto LAB_00183b40;
    }
    read_value<std::__cxx11::string>(&local_50,this,in,activationTag);
    std::__cxx11::string::~string((string *)&local_50);
  } while( true );
}

Assistant:

void read_layer_config(std::istream &in,
                           size_t &inputDim, size_t &outputDim,
                           std::string &activationTag,
                           Array &weights, Array &bias) {
        std::string tag;
        while (in && !in.eof()) {
            tag = read_tag(in);
            if (!in) { // trying to read past EOF or other errors
                throw std::runtime_error("unexpected end of layer record");
            }
            if (tag == "inputs:") {
                read_value<size_t>(in, inputDim);
            } else if (tag == "outputs:") {
                read_value<size_t>(in, outputDim);
            } else if (tag == "activation:") {
                read_value<std::string>(in, activationTag);
            } else if (tag == "bias_and_weights:") {
                weights.resize(inputDim * outputDim, 0.0);
                bias.resize(outputDim, 0.0);
                read_weights(in, weights, bias);
                break; // this should be the last layer attribute
            } else {
                throw std::runtime_error("unsupported layer attribute: " + tag);
            }
        };
    }